

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

const_iterator * __thiscall
QMultiHash<QByteArray,_QByteArray>::const_iterator::operator++(const_iterator *this)

{
  bool bVar1;
  MultiNode<QByteArray,_QByteArray> *pMVar2;
  iterator<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *this_00;
  const_iterator *in_RDI;
  iterator<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> iVar3;
  Chain **local_28;
  iterator<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *in_stack_ffffffffffffffe8;
  
  in_RDI->e = &(*in_RDI->e)->next;
  if (*in_RDI->e == (Chain *)0x0) {
    iVar3 = QHashPrivate::iterator<QHashPrivate::MultiNode<QByteArray,_QByteArray>_>::operator++
                      (in_stack_ffffffffffffffe8);
    this_00 = (iterator<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *)iVar3.bucket;
    bVar1 = QHashPrivate::iterator<QHashPrivate::MultiNode<QByteArray,_QByteArray>_>::atEnd
                      (&in_RDI->i);
    if (bVar1) {
      local_28 = (Chain **)0x0;
    }
    else {
      pMVar2 = QHashPrivate::iterator<QHashPrivate::MultiNode<QByteArray,_QByteArray>_>::node
                         (this_00);
      local_28 = &pMVar2->value;
    }
    in_RDI->e = local_28;
  }
  return in_RDI;
}

Assistant:

inline const_iterator &operator++() noexcept {
            Q_ASSERT(e && *e);
            e = &(*e)->next;
            Q_ASSERT(e);
            if (!*e) {
                ++i;
                e = i.atEnd() ? nullptr : &i.node()->value;
            }
            return *this;
        }